

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O0

void __thiscall YAJLTables::fetch_etable(YAJLTables *this,u16 marker,bitio_stream *bstream)

{
  ssize_t sVar1;
  YAJLHuffmanTable *pYVar2;
  YAJLEntropyTable *pYVar3;
  size_t in_RCX;
  undefined1 local_68 [8];
  YAJLEntropyTable etable_1;
  int i;
  undefined1 local_40 [8];
  YAJLEntropyTable etable;
  u16 length;
  bitio_stream *bstream_local;
  u16 marker_local;
  YAJLTables *this_local;
  
  sVar1 = bitio::bitio_stream::read(bstream,0x10,bstream,in_RCX);
  etable.arithmetic_table._6_2_ = (short)sVar1 + -2;
  if (marker == 0xffc4) {
    while (etable.arithmetic_table._6_2_ != 0) {
      local_40._0_2_ = 0;
      etable.marker = 0;
      etable._2_6_ = 0;
      etable.huffman_table = (YAJLHuffmanTable *)0x0;
      YAJLEntropyTable::set_marker((YAJLEntropyTable *)local_40,0xffc4);
      pYVar2 = (YAJLHuffmanTable *)operator_new(0x28);
      YAJLHuffmanTable::YAJLHuffmanTable(pYVar2,bstream);
      etable.arithmetic_table._6_2_ = etable.arithmetic_table._6_2_ + -0x11;
      for (etable_1.arithmetic_table._0_4_ = 0; (int)etable_1.arithmetic_table < 0x10;
          etable_1.arithmetic_table._0_4_ = (int)etable_1.arithmetic_table + 1) {
        etable.arithmetic_table._6_2_ =
             etable.arithmetic_table._6_2_ - (ushort)pYVar2->ncodes[(int)etable_1.arithmetic_table];
      }
      etable._0_8_ = pYVar2;
      if (3 < pYVar2->table_dest) {
        __assert_fail("etable.huffman_table->table_dest < 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/misc.cpp"
                      ,0x5e,"void YAJLTables::fetch_etable(u16, bitio::bitio_stream *)");
      }
      if (1 < pYVar2->table_class) {
        __assert_fail("etable.huffman_table->table_class < 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/misc.cpp"
                      ,0x5f,"void YAJLTables::fetch_etable(u16, bitio::bitio_stream *)");
      }
      pYVar3 = this->etables[pYVar2->table_dest] + pYVar2->table_class;
      *(ulong *)pYVar3 = CONCAT62(local_40._2_6_,local_40._0_2_);
      pYVar3->huffman_table = pYVar2;
      pYVar3->arithmetic_table = (YAJLArithmeticTable *)etable.huffman_table;
    }
  }
  else {
    if (marker != 0xffcc) {
      fprintf(_stderr,"Unhandled marker at: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/misc.cpp"
             );
      exit(1);
    }
    for (; etable.arithmetic_table._6_2_ != 0;
        etable.arithmetic_table._6_2_ = etable.arithmetic_table._6_2_ + -2) {
      local_68._0_2_ = 0;
      etable_1.marker = 0;
      etable_1._2_6_ = 0;
      etable_1.huffman_table = (YAJLHuffmanTable *)0x0;
      YAJLEntropyTable::set_marker((YAJLEntropyTable *)local_68,0xffcc);
      pYVar2 = (YAJLHuffmanTable *)operator_new(3);
      YAJLArithmeticTable::YAJLArithmeticTable((YAJLArithmeticTable *)pYVar2,bstream);
      etable_1.huffman_table = pYVar2;
      if (3 < *(u8 *)((long)&pYVar2->bstream + 1)) {
        __assert_fail("etable.arithmetic_table->table_dest < 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/misc.cpp"
                      ,0x69,"void YAJLTables::fetch_etable(u16, bitio::bitio_stream *)");
      }
      if (1 < *(byte *)&pYVar2->bstream) {
        __assert_fail("etable.arithmetic_table->table_class < 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/misc.cpp"
                      ,0x6a,"void YAJLTables::fetch_etable(u16, bitio::bitio_stream *)");
      }
      pYVar3 = this->etables[*(u8 *)((long)&pYVar2->bstream + 1)] + *(byte *)&pYVar2->bstream;
      *(ulong *)pYVar3 = CONCAT62(local_68._2_6_,local_68._0_2_);
      pYVar3->huffman_table = (YAJLHuffmanTable *)etable_1._0_8_;
      pYVar3->arithmetic_table = (YAJLArithmeticTable *)pYVar2;
    }
  }
  return;
}

Assistant:

void YAJLTables::fetch_etable(u16 marker, bitio::bitio_stream *bstream) {
    u16 length = bstream->read(0x10);
    length -= 2;
    if (marker == markers::DHT) {
        while (length > 0) {
            YAJLEntropyTable etable{};
            etable.set_marker(marker);
            etable.huffman_table = new YAJLHuffmanTable(bstream);

            length -= 17;
            for (int i = 0; i < 16; i++) {
                length -= etable.huffman_table->ncodes[i];
            }

            assert(etable.huffman_table->table_dest < 4);
            assert(etable.huffman_table->table_class < 2);

            etables[etable.huffman_table->table_dest][etable.huffman_table->table_class] = etable;
        }
    } else if (marker == markers::DAC) {
        while (length > 0) {
            YAJLEntropyTable etable{};
            etable.set_marker(marker);
            etable.arithmetic_table = new YAJLArithmeticTable(bstream);

            assert(etable.arithmetic_table->table_dest < 4);
            assert(etable.arithmetic_table->table_class < 2);
            etables[etable.arithmetic_table->table_dest][etable.arithmetic_table->table_class] = etable;
            length -= 2;
        }
    } else {
        fprintf(stderr, "Unhandled marker at: %s\n", __FILE__);
        exit(1);
    }
}